

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstate.cc
# Opt level: O2

bool __thiscall re2::BitState::ShouldVisit(BitState *this,int id,char *p)

{
  uint uVar1;
  uint *puVar2;
  uint uVar3;
  uint uVar4;
  
  uVar3 = ((int)p - *(int *)&(this->text_).data_) +
          ((int)(this->text_).size_ + 1) *
          (uint)((_Head_base<0UL,_unsigned_short_*,_false> *)
                ((long)&(this->prog_->list_heads_).ptr_._M_t.
                        super___uniq_ptr_impl<unsigned_short,_re2::PODArray<unsigned_short>::Deleter>
                        ._M_t.
                        super__Tuple_impl<0UL,_unsigned_short_*,_re2::PODArray<unsigned_short>::Deleter>
                + 8))->_M_head_impl[id];
  puVar2 = (this->visited_).ptr_._M_t.
           super___uniq_ptr_impl<unsigned_int,_re2::PODArray<unsigned_int>::Deleter>._M_t.
           super__Tuple_impl<0UL,_unsigned_int_*,_re2::PODArray<unsigned_int>::Deleter>.
           super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl;
  uVar1 = puVar2[(int)uVar3 / 0x20];
  uVar4 = 1 << ((byte)uVar3 & 0x1f);
  if ((uVar1 >> (uVar3 & 0x1f) & 1) == 0) {
    puVar2[(int)uVar3 / 0x20] = uVar4 | uVar1;
  }
  return (uVar4 & uVar1) == 0;
}

Assistant:

bool BitState::ShouldVisit(int id, const char* p) {
  int n = prog_->list_heads()[id] * static_cast<int>(text_.size()+1) +
          static_cast<int>(p-text_.data());
  if (visited_[n/VisitedBits] & (1 << (n & (VisitedBits-1))))
    return false;
  visited_[n/VisitedBits] |= 1 << (n & (VisitedBits-1));
  return true;
}